

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRpm.c
# Opt level: O2

void Abs_RpmPerformMark(Gia_Man_t *p,int nCutMax,int fVerbose,int fVeryVerbose)

{
  bool bVar1;
  int iVar2;
  uint nSize0;
  uint uVar3;
  Gia_Obj_t *pGVar4;
  Vec_Int_t *vPis;
  Vec_Int_t *vAnds;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  word *pTruth;
  int iVar5;
  uint i;
  ulong uVar6;
  char *pcVar7;
  uint uVar8;
  
  Gia_ManCreateRefs(p);
  Gia_ManCleanMark1(p);
  iVar5 = 0;
  while ((iVar5 < p->vCis->nSize - p->nRegs &&
         (pGVar4 = Gia_ManCi(p,iVar5), pGVar4 != (Gia_Obj_t *)0x0))) {
    *(ulong *)pGVar4 = *(ulong *)pGVar4 | 0x4000000000000000;
    iVar5 = iVar5 + 1;
  }
  vPis = Vec_IntAlloc(100);
  vAnds = Vec_IntAlloc(100);
  p_00 = Vec_IntAlloc(100);
  p_01 = Vec_IntAlloc(100);
  bVar1 = true;
  uVar6 = 0;
  do {
    if (!bVar1) {
      if (fVeryVerbose != 0) {
        Gia_ManCountPisNodes(p,vPis,vAnds);
        printf("Iter %3d :  ",uVar6);
        printf("PI = %5d  (%6.2f %%)  ",
               ((double)vPis->nSize * 100.0) / (double)(p->vCis->nSize - p->nRegs));
        uVar8 = vAnds->nSize;
        iVar5 = Gia_ManAndNum(p);
        printf("And = %6d  (%6.2f %%) ",((double)(int)uVar8 * 100.0) / (double)iVar5,(ulong)uVar8);
        putchar(10);
      }
      Vec_IntFree(vPis);
      Vec_IntFree(vAnds);
      Vec_IntFree(p_00);
      Vec_IntFree(p_01);
      if (p->pRefs != (int *)0x0) {
        free(p->pRefs);
        p->pRefs = (int *)0x0;
      }
      return;
    }
    p_02 = Gia_ManComputePiDoms(p);
    if (fVerbose == 0 && fVeryVerbose == 0) {
      uVar8 = p_02->nSize;
    }
    else {
      Gia_ManCountPisNodes(p,vPis,vAnds);
      printf("Iter %3d :  ",uVar6);
      printf("PI = %5d  (%6.2f %%)  ",
             ((double)vPis->nSize * 100.0) / (double)(p->vCis->nSize - p->nRegs));
      uVar8 = vAnds->nSize;
      iVar5 = Gia_ManAndNum(p);
      printf("And = %6d  (%6.2f %%) ",((double)(int)uVar8 * 100.0) / (double)iVar5,(ulong)uVar8);
      uVar8 = p_02->nSize;
      iVar5 = Gia_ManAndNum(p);
      printf("Dom = %5d  (%6.2f %%)  ",((double)(int)uVar8 * 100.0) / (double)iVar5,(ulong)uVar8);
      putchar(10);
    }
    i = 0;
    if ((int)uVar8 < 1) {
      uVar8 = 0;
    }
    bVar1 = false;
    for (; uVar8 != i; i = i + 1) {
      iVar5 = Vec_IntEntry(p_02,i);
      pGVar4 = Gia_ManObj(p,iVar5);
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      if (((undefined1  [12])*pGVar4 & (undefined1  [12])0x4000000000000000) !=
          (undefined1  [12])0x0) {
        __assert_fail("!pObj->fMark1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRpm.c"
                      ,0x2c9,"void Abs_RpmPerformMark(Gia_Man_t *, int, int, int)");
      }
      iVar5 = Gia_ObjRefNum(p,pGVar4);
      if (iVar5 < 1) {
        __assert_fail("Gia_ObjRefNum( p, pObj ) > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRpm.c"
                      ,0x2ca,"void Abs_RpmPerformMark(Gia_Man_t *, int, int, int)");
      }
      iVar5 = Abs_GiaObjDeref_rec(p,pGVar4);
      iVar2 = Abs_ManSupport2(p,pGVar4,p_01);
      if (nCutMax < iVar2) {
        Abs_GiaObjRef_rec(p,pGVar4);
      }
      else {
        nSize0 = Abs_GiaSortNodes(p,p_01);
        if (((int)nSize0 < 1) || (nCutMax < (int)nSize0)) {
          __assert_fail("nSize0 > 0 && nSize0 <= nCutMax",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRpm.c"
                        ,0x2eb,"void Abs_RpmPerformMark(Gia_Man_t *, int, int, int)");
        }
        pTruth = Gia_ObjComputeTruthTableCut(p,pGVar4,p_01);
        if (pTruth != (word *)0x0) {
          uVar3 = Abs_GiaCheckTruth(pTruth,p_01->nSize,nSize0);
          if (fVeryVerbose != 0) {
            printf("Nodes =%3d ",iVar5);
            printf("Size =%3d ",(ulong)(uint)p_01->nSize);
            printf("Size0 =%3d  ",(ulong)nSize0);
            pcVar7 = "no";
            if (uVar3 == 0) {
              pcVar7 = "yes";
            }
            printf("%3s",pcVar7);
            Abs_GiaCofPrint(pTruth,p_01->nSize,nSize0,uVar3 ^ 1);
          }
          if (uVar3 != 0) {
            *(ulong *)pGVar4 = *(ulong *)pGVar4 | 0x4000000000000000;
            bVar1 = true;
            goto LAB_0049626d;
          }
        }
        Abs_GiaObjRef_rec(p,pGVar4);
      }
LAB_0049626d:
    }
    Vec_IntFree(p_02);
    uVar6 = (ulong)((int)uVar6 + 1);
  } while( true );
}

Assistant:

void Abs_RpmPerformMark( Gia_Man_t * p, int nCutMax, int fVerbose, int fVeryVerbose )
{
    Vec_Int_t * vPis, * vAnds, * vDoms;
    Vec_Int_t * vSupp, * vSupp1, * vSupp2;
    Gia_Obj_t * pObj;
    word * pTruth;
    int Iter, i, nSize0, nNodes;
    int fHasConst, fChanges = 1;
    Gia_ManCreateRefs( p );
    Gia_ManCleanMark1( p );
    Gia_ManForEachPi( p, pObj, i )
        pObj->fMark1 = 1;
    vPis = Vec_IntAlloc( 100 );
    vAnds = Vec_IntAlloc( 100 );
    vSupp1 = Vec_IntAlloc( 100 );
    vSupp2 = Vec_IntAlloc( 100 );
    for ( Iter = 0; fChanges; Iter++ )
    {
        fChanges = 0;
        vDoms = Gia_ManComputePiDoms( p );
        // count the number of PIs and internal nodes
        if ( fVerbose || fVeryVerbose )
        {
            Gia_ManCountPisNodes( p, vPis, vAnds );
            printf( "Iter %3d :  ", Iter );
            printf( "PI = %5d  (%6.2f %%)  ",  Vec_IntSize(vPis),  100.0 * Vec_IntSize(vPis)  / Gia_ManPiNum(p)  );
            printf( "And = %6d  (%6.2f %%) ",  Vec_IntSize(vAnds), 100.0 * Vec_IntSize(vAnds) / Gia_ManAndNum(p) );
            printf( "Dom = %5d  (%6.2f %%)  ", Vec_IntSize(vDoms), 100.0 * Vec_IntSize(vDoms) / Gia_ManAndNum(p)  );
            printf( "\n" );
        }
//        pObj = Gia_ObjFanin0( Gia_ManPo(p, 1) );
        Gia_ManForEachObjVec( vDoms, p, pObj, i )
        {
            assert( !pObj->fMark1 );
            assert( Gia_ObjRefNum( p, pObj ) > 0 );
            // dereference root node
            nNodes = Abs_GiaObjDeref_rec( p, pObj );
/*
            // compute support of full cone
            if ( Abs_ManSupport1(p, pObj, vSupp1) > nCutMax )
//            if ( 1 )
            {
                // check support of MFFC
                if ( Abs_ManSupport2(p, pObj, vSupp2) > nCutMax )
//                if ( 1 )
                {
                    Abs_GiaObjRef_rec( p, pObj );
                    continue;
                }
                vSupp = vSupp2;
//                printf( "-" );
            }
            else
            {
                vSupp = vSupp1;
//                printf( "+" );
            }
*/
            if ( Abs_ManSupport2(p, pObj, vSupp2) > nCutMax )
            {
                Abs_GiaObjRef_rec( p, pObj );
                continue;
            }
            vSupp = vSupp2;

            // order nodes by their ref counts
            nSize0 = Abs_GiaSortNodes( p, vSupp );
            assert( nSize0 > 0 && nSize0 <= nCutMax );
            // check if truth table has const cofs
            pTruth = Gia_ObjComputeTruthTableCut( p, pObj, vSupp );
            if ( pTruth == NULL )
            {
                Abs_GiaObjRef_rec( p, pObj );
                continue;
            }
            fHasConst = !Abs_GiaCheckTruth( pTruth, Vec_IntSize(vSupp), nSize0 );
            if ( fVeryVerbose )
            {
                printf( "Nodes =%3d ",  nNodes );
                printf( "Size =%3d ",   Vec_IntSize(vSupp) );
                printf( "Size0 =%3d  ", nSize0 );
                printf( "%3s", fHasConst ? "yes" : "no" );
                Abs_GiaCofPrint( pTruth, Vec_IntSize(vSupp), nSize0, fHasConst );
            }
            if ( fHasConst )
            {
                Abs_GiaObjRef_rec( p, pObj );
                continue;
            }
            // pObj can be reparamed
            pObj->fMark1 = 1;
            fChanges = 1;
        }
        Vec_IntFree( vDoms );
    }
    // count the number of PIs and internal nodes
    if ( fVeryVerbose )
    {
        Gia_ManCountPisNodes( p, vPis, vAnds );
        printf( "Iter %3d :  ", Iter );
        printf( "PI = %5d  (%6.2f %%)  ",  Vec_IntSize(vPis),  100.0 * Vec_IntSize(vPis)  / Gia_ManPiNum(p)  );
        printf( "And = %6d  (%6.2f %%) ",  Vec_IntSize(vAnds), 100.0 * Vec_IntSize(vAnds) / Gia_ManAndNum(p) );
//        printf( "Dom = %5d  (%6.2f %%)  ", Vec_IntSize(vDoms), 100.0 * Vec_IntSize(vDoms) / Gia_ManAndNum(p)  );
        printf( "\n" );
    }
    // cleanup
    Vec_IntFree( vPis );
    Vec_IntFree( vAnds );
    Vec_IntFree( vSupp1 );
    Vec_IntFree( vSupp2 );
//    Gia_ManCleanMark1( p ); // this will erase markings
    ABC_FREE( p->pRefs );
}